

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O1

QRectF * __thiscall QRectF::operator&(QRectF *this,QRectF *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  QRectF *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar1 = this->w;
  dVar10 = this->xp;
  dVar6 = dVar10 + dVar1;
  if (0.0 <= dVar1) {
    dVar6 = dVar10;
  }
  dVar1 = (double)(~-(ulong)(dVar1 < 0.0) & (ulong)(dVar10 + dVar1) |
                  (ulong)dVar10 & -(ulong)(dVar1 < 0.0));
  if ((dVar6 != dVar1) || (NAN(dVar6) || NAN(dVar1))) {
    dVar10 = r->w;
    dVar2 = r->xp;
    dVar7 = dVar2 + dVar10;
    if (0.0 <= dVar10) {
      dVar7 = dVar2;
    }
    auVar5._0_8_ = (double)(~-(ulong)(dVar10 < 0.0) & (ulong)(dVar2 + dVar10) |
                           (ulong)dVar2 & -(ulong)(dVar10 < 0.0));
    if ((((dVar7 != auVar5._0_8_) || (NAN(dVar7) || NAN(auVar5._0_8_))) && (dVar6 < auVar5._0_8_))
       && (dVar7 < dVar1)) {
      dVar10 = this->h;
      dVar2 = this->yp;
      dVar11 = dVar2 + dVar10;
      if (0.0 <= dVar10) {
        dVar11 = dVar2;
      }
      dVar10 = (double)(~-(ulong)(dVar10 < 0.0) & (ulong)(dVar2 + dVar10) |
                       (ulong)dVar2 & -(ulong)(dVar10 < 0.0));
      if ((dVar11 != dVar10) || (NAN(dVar11) || NAN(dVar10))) {
        dVar2 = r->h;
        dVar3 = r->yp;
        dVar12 = dVar3 + dVar2;
        if (0.0 <= dVar2) {
          dVar12 = dVar3;
        }
        dVar2 = (double)(~-(ulong)(dVar2 < 0.0) & (ulong)(dVar3 + dVar2) |
                        (ulong)dVar3 & -(ulong)(dVar2 < 0.0));
        if (((dVar12 != dVar2) || (NAN(dVar12) || NAN(dVar2))) &&
           ((dVar11 < dVar2 && (dVar12 < dVar10)))) {
          auVar8._8_8_ = dVar12;
          auVar8._0_8_ = dVar7;
          auVar9._8_8_ = dVar11;
          auVar9._0_8_ = dVar6;
          auVar9 = maxpd(auVar8,auVar9);
          auVar4._8_8_ = dVar10;
          auVar4._0_8_ = dVar1;
          auVar5._8_8_ = dVar2;
          auVar5 = minpd(auVar4,auVar5);
          in_RDI->xp = (qreal)auVar9._0_8_;
          in_RDI->yp = (qreal)auVar9._8_8_;
          in_RDI->w = auVar5._0_8_ - auVar9._0_8_;
          in_RDI->h = auVar5._8_8_ - auVar9._8_8_;
          return in_RDI;
        }
      }
    }
  }
  in_RDI->w = 0.0;
  in_RDI->h = 0.0;
  in_RDI->xp = 0.0;
  in_RDI->yp = 0.0;
  return in_RDI;
}

Assistant:

QRectF QRectF::operator&(const QRectF &r) const noexcept
{
    qreal l1 = xp;
    qreal r1 = xp;
    if (w < 0)
        l1 += w;
    else
        r1 += w;
    if (l1 == r1) // null rect
        return QRectF();

    qreal l2 = r.xp;
    qreal r2 = r.xp;
    if (r.w < 0)
        l2 += r.w;
    else
        r2 += r.w;
    if (l2 == r2) // null rect
        return QRectF();

    if (l1 >= r2 || l2 >= r1)
        return QRectF();

    qreal t1 = yp;
    qreal b1 = yp;
    if (h < 0)
        t1 += h;
    else
        b1 += h;
    if (t1 == b1) // null rect
        return QRectF();

    qreal t2 = r.yp;
    qreal b2 = r.yp;
    if (r.h < 0)
        t2 += r.h;
    else
        b2 += r.h;
    if (t2 == b2) // null rect
        return QRectF();

    if (t1 >= b2 || t2 >= b1)
        return QRectF();

    QRectF tmp;
    tmp.xp = qMax(l1, l2);
    tmp.yp = qMax(t1, t2);
    tmp.w = qMin(r1, r2) - tmp.xp;
    tmp.h = qMin(b1, b2) - tmp.yp;
    return tmp;
}